

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O0

int CVmObjString::getp_split(vm_val_t *retval,vm_val_t *self_val,char *str,uint *argcp)

{
  int iVar1;
  int iVar2;
  vm_obj_id_t vVar3;
  vm_val_t *pvVar4;
  char *pcVar5;
  size_t sVar6;
  uint *in_RCX;
  long in_RDX;
  vm_val_t *in_RSI;
  vm_val_t *in_RDI;
  size_t skip;
  char *nxt;
  int match_len;
  int match_ofs;
  vm_val_t ele;
  int cnt;
  CVmObjList *lst;
  int init_list_len;
  int32_t limit;
  int split_len;
  CVmObjPattern *delim_pat;
  char *delim_str;
  vm_val_t *delim;
  char *basestr;
  size_t len;
  uint argc;
  vm_val_t *in_stack_ffffffffffffff28;
  vm_val_t *in_stack_ffffffffffffff30;
  vm_val_t *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff50;
  uint uVar7;
  uint uVar8;
  char *in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff60;
  vm_datatype_t in_stack_ffffffffffffff68;
  vm_datatype_t in_stack_ffffffffffffff6c;
  anon_union_8_8_cb74652f_for_val in_stack_ffffffffffffff70;
  anon_union_8_8_cb74652f_for_val in_stack_ffffffffffffff78;
  int local_7c;
  undefined4 in_stack_ffffffffffffff90;
  int32_t iVar9;
  size_t local_40;
  char *local_20;
  
  if ((getp_split(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_split(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::
                                   desc), iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_split::desc,0,2);
    __cxa_guard_release(&getp_split(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc);
  }
  if (in_RCX == (uint *)0x0) {
    uVar7 = 0;
  }
  else {
    uVar7 = *in_RCX;
  }
  uVar8 = uVar7;
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffff38,&in_stack_ffffffffffffff30->typ,
                     (CVmNativeCodeDesc *)in_stack_ffffffffffffff28);
  if (iVar1 == 0) {
    local_40 = vmb_get_len((char *)0x33b4a3);
    local_20 = (char *)(in_RDX + 2);
    pvVar4 = CVmStack::get(0);
    iVar1 = 0;
    if ((uVar7 == 0) || (pvVar4->typ == VM_NIL)) {
      iVar1 = 1;
    }
    else if (pvVar4->typ == VM_INT) {
      iVar1 = (pvVar4->val).intval;
      if (iVar1 < 1) {
        err_throw(0);
      }
    }
    else {
      pcVar5 = vm_val_t::get_as_string(in_stack_ffffffffffffff28);
      if (pcVar5 == (char *)0x0) {
        if ((pvVar4->typ != VM_OBJ) || (iVar2 = CVmObjPattern::is_pattern_obj(0), iVar2 == 0)) {
          err_throw(0);
        }
        vm_objp(0);
      }
    }
    iVar9 = -1;
    if ((1 < uVar7) && (pvVar4 = CVmStack::get(1), pvVar4->typ != VM_NIL)) {
      CVmStack::get(1);
      iVar9 = vm_val_t::num_to_int(in_stack_ffffffffffffff30);
      if (iVar9 < 1) {
        err_throw(0);
      }
    }
    CVmStack::push(in_RSI);
    iVar2 = iVar9;
    if (iVar9 < 1) {
      if (iVar1 < 1) {
        iVar2 = 10;
      }
      else {
        iVar2 = (int)(((local_40 + (long)iVar1) - 1) / (ulong)(long)iVar1);
        if ((iVar2 < 1) && (local_40 != 0)) {
          iVar2 = 1;
        }
      }
    }
    pvVar4 = in_RDI;
    vVar3 = CVmObjList::create((int)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                               (size_t)in_stack_ffffffffffffff28);
    vm_val_t::set_obj(pvVar4,vVar3);
    vm_objp(0);
    CVmObjList::cons_clear((CVmObjList *)in_stack_ffffffffffffff30);
    CVmStack::push(in_RDI);
    local_7c = 0;
    while( true ) {
      if ((iVar9 < 0) ||
         (in_stack_ffffffffffffff44 = in_stack_ffffffffffffff44 & 0xffffff, local_7c + 1 < iVar9)) {
        in_stack_ffffffffffffff44 = CONCAT13(local_40 != 0,(int3)in_stack_ffffffffffffff44);
      }
      if ((char)(in_stack_ffffffffffffff44 >> 0x18) == '\0') break;
      if (iVar1 < 1) {
        in_stack_ffffffffffffff28 = (vm_val_t *)&stack0xffffffffffffff6c;
        in_stack_ffffffffffffff30 = (vm_val_t *)&stack0xffffffffffffff68;
        in_stack_ffffffffffffff60 =
             find_substr((vm_val_t *)in_stack_ffffffffffffff78.native_desc,
                         (char *)in_stack_ffffffffffffff70.ptr,
                         (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                         (size_t)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                         (CVmObjPattern *)CONCAT44(uVar8,in_stack_ffffffffffffff50),
                         (int *)CONCAT44(iVar2,in_stack_ffffffffffffff90),
                         (int *)CONCAT44(iVar1,iVar9));
        if (in_stack_ffffffffffffff60 == (char *)0x0) break;
        in_stack_ffffffffffffff6c = (int)in_stack_ffffffffffffff60 - (int)local_20;
      }
      else {
        sVar6 = utf8_ptr::s_bytelen((char *)in_stack_ffffffffffffff30,
                                    (size_t)in_stack_ffffffffffffff28);
        in_stack_ffffffffffffff6c = (vm_datatype_t)sVar6;
        if ((int)local_40 <= (int)in_stack_ffffffffffffff6c) break;
        in_stack_ffffffffffffff68 = 0;
      }
      CVmObjList::cons_ensure_space
                ((CVmObjList *)CONCAT44(uVar8,in_stack_ffffffffffffff50),(size_t)pvVar4,
                 CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      vVar3 = create(in_stack_ffffffffffffff44,(char *)in_stack_ffffffffffffff38,
                     (size_t)in_stack_ffffffffffffff30);
      vm_val_t::set_obj((vm_val_t *)&stack0xffffffffffffff70,vVar3);
      CVmObjList::cons_set_element
                ((CVmObjList *)in_stack_ffffffffffffff30,(size_t)in_stack_ffffffffffffff28,
                 (vm_val_t *)0x33b7e3);
      in_stack_ffffffffffffff58 =
           (char *)(long)(int)(in_stack_ffffffffffffff6c + in_stack_ffffffffffffff68);
      local_20 = in_stack_ffffffffffffff58 + (long)local_20;
      local_40 = local_40 - (long)in_stack_ffffffffffffff58;
      if (((iVar1 == 0) && (in_stack_ffffffffffffff68 == 0)) && (local_40 != 0)) {
        sVar6 = utf8_ptr::s_bytelen((char *)in_stack_ffffffffffffff30,
                                    (size_t)in_stack_ffffffffffffff28);
        local_20 = local_20 + sVar6;
      }
      local_7c = local_7c + 1;
    }
    if (local_40 != 0) {
      CVmObjList::cons_ensure_space
                ((CVmObjList *)CONCAT44(uVar8,in_stack_ffffffffffffff50),(size_t)pvVar4,
                 CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      vVar3 = create(in_stack_ffffffffffffff44,(char *)in_stack_ffffffffffffff38,
                     (size_t)in_stack_ffffffffffffff30);
      vm_val_t::set_obj((vm_val_t *)&stack0xffffffffffffff70,vVar3);
      CVmObjList::cons_set_element
                ((CVmObjList *)in_stack_ffffffffffffff30,(size_t)in_stack_ffffffffffffff28,
                 (vm_val_t *)0x33b8c1);
    }
    CVmObjList::cons_set_len
              ((CVmObjList *)in_stack_ffffffffffffff30,(size_t)in_stack_ffffffffffffff28);
    CVmStack::discard(uVar7 + 2);
  }
  return 1;
}

Assistant:

int CVmObjString::getp_split(VMG_ vm_val_t *retval,
                             const vm_val_t *self_val,
                             const char *str, uint *argcp)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(0, 2);
    uint argc = (argcp != 0 ? *argcp : 0);
    if (get_prop_check_argc(retval, argcp, &desc))
        return TRUE;

    /* get the string buffer and length */
    size_t len = vmb_get_len(str);
    str += VMB_LEN;

    /* remember the start of the base string */
    const char *basestr = str;

    /* 
     *   Get the delimiter or split size, leaving it on the stack for gc
     *   protection.  This can be a string, a RexPattern, or an integer.  
     */
    const vm_val_t *delim = G_stk->get(0);
    const char *delim_str = 0;
    CVmObjPattern *delim_pat = 0;
    int split_len = 0;
    if (argc < 1 || delim->typ == VM_NIL)
    {
        /* there's no delimiter at all, so use the default split length 1 */
        split_len = 1;
    }
    else if (delim->typ == VM_INT)
    {
        /* it's a simple split length */
        split_len = delim->val.intval;
        if (split_len <= 0)
            err_throw(VMERR_BAD_VAL_BIF);
    }
    else if ((delim_str = delim->get_as_string(vmg0_)) == 0)
    {
        /* if it's not a length or string, it has to be a RexPattern object */
        if (delim->typ != VM_OBJ
            || !CVmObjPattern::is_pattern_obj(vmg_ delim->val.obj))
            err_throw(VMERR_BAD_TYPE_BIF);

        /* get the pattern object, properly cast */
        delim_pat = (CVmObjPattern *)vm_objp(vmg_ delim->val.obj);
    }

    /* get the split count limit, if there is one */
    int32_t limit = -1;
    if (argc >= 2 && G_stk->get(1)->typ != VM_NIL)
    {
        /* there's an explicit limit; fetch it and make sure it's at least 1 */
        if ((limit = G_stk->get(1)->num_to_int(vmg0_)) < 1)
            err_throw(VMERR_BAD_VAL_BIF);
    }

    /* push 'self' for gc protection */
    G_stk->push(self_val);

    /* 
     *   Set up a return list.  If we have a limit, the list can't go over
     *   that length, so just create the list at the limit.  Otherwise, if we
     *   have a split length, we can figure the required list length by
     *   dividing the string length by the split length (rounding up).
     *   Otherwise we have no idea how many list elements we'll need, so just
     *   create the list at an arbitrary default length and expand later if
     *   needed.  
     */
    int init_list_len;
    if (limit > 0)
    {
        /* there's a limit, so we won't need more than this many elements */
        init_list_len = limit;
    }
    else if (split_len > 0)
    {
        /* split length -> divide the string length by the split length */
        init_list_len = (len + split_len - 1)/split_len;

        /* set the length to at least one, unless it's an empty string */
        if (init_list_len < 1 && len != 0)
            init_list_len = 1;
    }
    else
    {
        /* no limit or length, so start with an arbitrary guess */
        init_list_len = 10;
    }

    /* create the list */
    retval->set_obj(CVmObjList::create(vmg_ FALSE, init_list_len));
    CVmObjList *lst = (CVmObjList *)vm_objp(vmg_ retval->val.obj);

    /* clear the list to nils, since we're building it incrementally */
    lst->cons_clear();

    /* push it for gc protection */
    G_stk->push(retval);

    /* repeatedly search for the delimiter and split the string */
    int cnt;
    vm_val_t ele;
    for (cnt = 0 ; (limit < 0 || cnt + 1 < limit) && len != 0 ; ++cnt)
    {
        /* search for the next delimiter or next 'split_len' characters */
        int match_ofs, match_len;
        if (split_len > 0)
        {
            /* figure the number of bytes in split_len characters */
            match_ofs = utf8_ptr::s_bytelen(str, split_len);

            /* if that uses the whole rest of the string, we're done */
            if (match_ofs >= (int)len)
                break;

            /* there's no delimiter, so the delimiter match length is zero */
            match_len = 0;
        }
        else
        {
            /* search for the substring or pattern */
            const char *nxt = find_substr(
                vmg_ self_val, basestr, str, len, delim_str, delim_pat,
                &match_ofs, &match_len);

            /* if we didn't find it, we're done */
            if (nxt == 0)
                break;

            /* figure the byte offset to the match */
            match_ofs = nxt - str;
        }

        /* add the substring from 'str' to 'p' to the list */
        lst->cons_ensure_space(vmg_ cnt, 0);
        ele.set_obj(CVmObjString::create(vmg_ FALSE, str, match_ofs));
        lst->cons_set_element(cnt, &ele);

        /* skip to the position after the match */
        size_t skip = match_ofs + match_len;
        str += skip;
        len -= skip;

        /* 
         *   if we matched zero characters, skip one character to prevent an
         *   infinite loop 
         */
        if (split_len == 0 && match_len == 0 && len != 0)
            str += utf8_ptr::s_bytelen(str, 1);
    }

    /* add a final element for the remainder of the string */
    if (len != 0)
    {
        lst->cons_ensure_space(vmg_ cnt, 0);
        ele.set_obj(CVmObjString::create(vmg_ FALSE, str, len));
        lst->cons_set_element(cnt, &ele);

        /* count it */
        ++cnt;
    }

    /* set the final size of the list */
    lst->cons_set_len(cnt);

    /* discard arguments plus gc protection */
    G_stk->discard(argc + 2);

    /* handled */
    return TRUE;
}